

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilteringRegister.hpp
# Opt level: O1

void __thiscall
supermap::
FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>::
FilteringRegister(FilteringRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>
                  *this,function<std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_()>
                        *filterSupplier,
                 function<supermap::Key<128UL>_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&)>
                 *func)

{
  undefined8 uVar1;
  
  (this->
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ).
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>
  ._vptr_Cloneable = (_func_int **)&PTR_clone_00207ad8;
  if ((filterSupplier->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*filterSupplier->_M_invoker)((_Any_data *)&this->filter_);
    *(undefined8 *)&(this->func_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = 0;
    (this->func_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->func_)._M_invoker = func->_M_invoker;
    if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
      uVar1 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
      *(undefined8 *)&(this->func_).super__Function_base._M_functor =
           *(undefined8 *)&(func->super__Function_base)._M_functor;
      *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = uVar1;
      (this->func_).super__Function_base._M_manager = (func->super__Function_base)._M_manager;
      (func->super__Function_base)._M_manager = (_Manager_type)0x0;
      func->_M_invoker = (_Invoker_type)0x0;
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

explicit FilteringRegister(
        std::function<std::shared_ptr<FilterBase>()> filterSupplier,
        std::function<FilterT(const RegisterT &)> func
    ) : filter_(filterSupplier()), func_(std::move(func)) {}